

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshes.cpp
# Opt level: O3

Mesh * vera::cylinderMesh(Mesh *__return_storage_ptr__,float _radius,float _height,
                         int _radiusSegments,int _heightSegments,int _numCapSegments,bool _bCapped,
                         DrawMode _drawMode)

{
  bool bVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  int iVar4;
  uint32_t uVar5;
  int iVar6;
  int iVar7;
  int iy;
  int iVar8;
  int iVar9;
  uint32_t uVar10;
  bool bVar11;
  float fVar12;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [12];
  float fVar16;
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  float fVar19;
  float fVar20;
  undefined1 auVar21 [12];
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  vec2 tcoord;
  vec3 vert;
  float a;
  anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 local_1a4;
  float local_1a0;
  DrawMode local_19c;
  float local_198;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_194;
  float local_190;
  float local_18c;
  vec3 local_188;
  undefined1 local_178 [16];
  ulong local_160;
  float local_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  undefined1 local_148 [16];
  float local_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  ulong local_128;
  float local_120;
  float local_11c;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  float local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  float local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  float local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  float local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined1 local_58 [16];
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  local_108._8_8_ = local_108._0_8_;
  local_118._0_4_ = _height;
  local_138 = _radius;
  uStack_134 = in_XMM0_Db;
  uStack_130 = in_XMM0_Dc;
  uStack_12c = in_XMM0_Dd;
  Mesh::Mesh(__return_storage_ptr__);
  local_19c = TRIANGLE_STRIP;
  if (0xfffffffd < _drawMode - TRIANGLE_FAN) {
    local_19c = _drawMode;
  }
  if (_heightSegments < 2) {
    _heightSegments = 1;
  }
  local_108._4_4_ = 0;
  local_108._0_4_ = _heightSegments;
  bVar1 = 0 < _numCapSegments;
  uVar2 = _numCapSegments + 1;
  if (!bVar1 || !_bCapped) {
    uVar2 = 1;
  }
  local_128 = (ulong)uVar2;
  iVar4 = _radiusSegments + 1;
  local_198 = (float)iVar4 + -1.0;
  local_58 = ZEXT416((uint)(-6.2831855 / local_198));
  __return_storage_ptr__->m_drawMode = local_19c;
  local_11c = (float)(int)(_heightSegments + 1) + -1.0;
  local_48 = (float)local_118._0_4_ * 0.5;
  local_120 = (float)(int)(uVar2 * 2) + -2.0 + local_11c;
  uStack_44 = 0;
  uStack_40 = 0;
  uStack_3c = 0;
  local_160 = (ulong)(uint)_numCapSegments;
  if (bVar1 && _bCapped) {
    local_178 = ZEXT416((uint)(((float)(int)uVar2 + -1.0) / local_120));
    local_188.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
    local_188.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0xbf800000;
    local_188.field_2.z = 0.0;
    local_158 = ABS(0.0 - (float)_numCapSegments);
    uStack_154 = 0;
    uStack_150 = 0;
    uStack_14c = 0;
    local_88._4_4_ = 0x80000000;
    local_88._0_4_ = -local_48;
    local_88._8_4_ = 0x80000000;
    local_88._12_4_ = 0x80000000;
    iVar8 = 0;
    do {
      if (-1 < _radiusSegments) {
        fVar12 = (float)iVar8 / (float)_numCapSegments;
        fVar13 = fVar12 * local_138 + 0.0;
        fVar12 = fVar12 * (float)local_178._0_4_ + 0.0;
        bVar11 = fVar13 <= local_138;
        local_78._0_4_ = local_138;
        if (fVar13 <= local_138) {
          local_78._0_4_ = fVar13;
        }
        local_78._4_4_ = uStack_134;
        local_78._8_4_ = uStack_130;
        local_78._12_4_ = uStack_12c;
        local_98 = local_138;
        if (local_138 <= fVar13) {
          local_98 = fVar13;
        }
        uStack_94 = uStack_134;
        uStack_90 = uStack_130;
        uStack_8c = uStack_12c;
        local_a8._0_4_ = -(uint)(fVar13 <= 0.0 || fVar13 < local_138);
        local_b8._0_4_ = -(uint)(0.0 <= fVar12 || (float)local_178._0_4_ < fVar12);
        local_c8 = (float)local_178._0_4_;
        if (fVar12 <= (float)local_178._0_4_) {
          local_c8 = fVar12;
        }
        uStack_c4 = local_178._4_4_;
        uStack_c0 = local_178._8_4_;
        uStack_bc = local_178._12_4_;
        local_d8 = (float)local_178._0_4_;
        if ((float)local_178._0_4_ <= fVar12) {
          local_d8 = fVar12;
        }
        uStack_d4 = local_178._4_4_;
        uStack_d0 = local_178._8_4_;
        uStack_cc = local_178._12_4_;
        local_e8._0_4_ = -(uint)(fVar12 <= 0.0 || fVar12 < (float)local_178._0_4_);
        iVar6 = 0;
        do {
          fVar12 = 0.0;
          if (1.1920929e-07 <= local_158) {
            if (0.0 <= local_138) {
              fVar12 = (float)local_78._0_4_;
              if (fVar13 < 0.0 && bVar11) goto LAB_002116c4;
            }
            else {
              fVar12 = local_98;
              if ((local_a8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
LAB_002116c4:
                fVar12 = 0.0;
              }
            }
          }
          local_148._0_4_ = fVar12;
          local_68 = (float)iVar6;
          local_f8._4_4_ = local_58._4_4_;
          local_f8._0_4_ = (float)local_58._0_4_ * local_68;
          local_f8._8_4_ = local_58._8_4_;
          local_f8._12_4_ = local_58._12_4_;
          fVar12 = cosf((float)local_58._0_4_ * local_68);
          local_194.x = fVar12 * (float)local_148._0_4_;
          local_18c = sinf((float)local_f8._0_4_);
          local_18c = local_18c * (float)local_148._0_4_;
          local_190 = (float)local_88._0_4_;
          local_1a4.x = local_68 / local_198;
          if (1.1920929e-07 <= local_158) {
            local_1a0 = local_c8;
            auVar3 = local_b8;
            if ((float)local_178._0_4_ < 0.0) {
              local_1a0 = local_d8;
              auVar3 = local_e8;
            }
            if ((auVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) goto LAB_0021175a;
          }
          else {
LAB_0021175a:
            local_1a0 = 0.0;
          }
          local_1a0 = 1.0 - local_1a0;
          Mesh::addTexCoord(__return_storage_ptr__,(vec2 *)&local_1a4);
          Mesh::addVertex(__return_storage_ptr__,(vec3 *)&local_194);
          Mesh::addNormal(__return_storage_ptr__,&local_188);
          iVar6 = iVar6 + 1;
        } while (iVar4 != iVar6);
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 != (int)local_128);
    fVar12 = (float)local_160;
    if (local_19c == TRIANGLES) {
      local_158 = 1.4013e-45;
      if (1 < (int)fVar12) {
        local_158 = fVar12;
      }
      fVar12 = 0.0;
      do {
        if (_radiusSegments < 1) {
          fVar12 = (float)((int)fVar12 + 1);
        }
        else {
          uVar10 = (int)fVar12 * iVar4;
          local_148._0_4_ = (int)fVar12 + 1;
          uVar5 = ((int)fVar12 + 1) * iVar4;
          iVar8 = _radiusSegments;
          do {
            if (fVar12 != 0.0) {
              Mesh::addIndex(__return_storage_ptr__,uVar10);
              Mesh::addIndex(__return_storage_ptr__,uVar10 + 1);
              Mesh::addIndex(__return_storage_ptr__,uVar5);
            }
            uVar10 = uVar10 + 1;
            Mesh::addIndex(__return_storage_ptr__,uVar10);
            Mesh::addIndex(__return_storage_ptr__,uVar5 + 1);
            Mesh::addIndex(__return_storage_ptr__,uVar5);
            iVar8 = iVar8 + -1;
            uVar5 = uVar5 + 1;
          } while (iVar8 != 0);
          fVar12 = (float)local_148._0_4_;
        }
      } while (fVar12 != local_158);
    }
    else {
      fVar13 = 1.4013e-45;
      if (1 < (int)fVar12) {
        fVar13 = fVar12;
      }
      fVar12 = 0.0;
      do {
        if (-1 < _radiusSegments) {
          uVar5 = (int)fVar12 * iVar4;
          uVar10 = ((int)fVar12 + 1) * iVar4;
          iVar8 = iVar4;
          do {
            Mesh::addIndex(__return_storage_ptr__,uVar5);
            Mesh::addIndex(__return_storage_ptr__,uVar10);
            uVar10 = uVar10 + 1;
            uVar5 = uVar5 + 1;
            iVar8 = iVar8 + -1;
          } while (iVar8 != 0);
        }
        fVar12 = (float)((int)fVar12 + 1);
      } while (fVar12 != fVar13);
    }
    iVar8 = (int)((ulong)((long)(__return_storage_ptr__->m_vertices).
                                super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(__return_storage_ptr__->m_vertices).
                               super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555;
  }
  else {
    local_88._4_4_ = 0x80000000;
    local_88._0_4_ = -local_48;
    local_88._8_4_ = 0x80000000;
    local_88._12_4_ = 0x80000000;
    iVar8 = 0;
    local_178 = ZEXT816(0);
  }
  fVar12 = (float)(int)(_heightSegments + 1) / local_120;
  auVar15._4_8_ = 0;
  auVar15._0_4_ = fVar12;
  if (!bVar1 || !_bCapped) {
    auVar15 = ZEXT812(0x3f800000);
  }
  local_f8._12_4_ = 0;
  local_f8._0_12_ = auVar15;
  local_118._0_4_ = (float)local_118._0_4_ / local_11c;
  local_d8 = (float)(int)local_108._0_4_;
  local_78 = ZEXT416((uint)ABS(0.0 - local_d8));
  local_e8._0_4_ = auVar15._0_4_ - (float)local_178._0_4_;
  local_e8._4_8_ = auVar15._4_8_;
  local_e8._12_4_ = 0;
  local_148._0_8_ = local_58._0_8_ ^ 0x8000000080000000;
  local_148._8_4_ = local_58._8_4_ ^ 0x80000000;
  local_148._12_4_ = local_58._12_4_ ^ 0x80000000;
  iVar6 = 0;
  do {
    local_188.field_0.x = 1.0;
    local_188.field_1.y = 0.0;
    local_188.field_2.z = 0.0;
    if (-1 < _radiusSegments) {
      fVar13 = ((float)iVar6 / local_d8) * (float)local_e8._0_4_ + (float)local_178._0_4_;
      local_98 = (float)local_f8._0_4_;
      if (fVar13 <= (float)local_f8._0_4_) {
        local_98 = fVar13;
      }
      uStack_94 = local_f8._4_4_;
      uStack_90 = local_f8._8_4_;
      uStack_8c = local_f8._12_4_;
      local_a8._0_4_ = local_f8._0_4_;
      if ((float)local_f8._0_4_ <= fVar13) {
        local_a8._0_4_ = fVar13;
      }
      local_a8._4_4_ = local_f8._4_4_;
      local_a8._8_4_ = local_f8._8_4_;
      local_a8._12_4_ = local_f8._12_4_;
      local_b8._0_4_ = -(uint)((float)local_f8._0_4_ < fVar13 || (float)local_178._0_4_ <= fVar13);
      fVar24 = (float)local_118._0_4_ * (float)iVar6 + (float)local_88._0_4_;
      local_c8 = (float)-(uint)(fVar13 <= (float)local_178._0_4_ || fVar13 < (float)local_f8._0_4_);
      iVar7 = 0;
      do {
        local_158 = (float)iVar7;
        local_68 = (float)local_58._0_4_ * local_158;
        uStack_64 = local_58._4_4_;
        uStack_60 = local_58._8_4_;
        uStack_5c = local_58._12_4_;
        fVar13 = cosf(local_68);
        local_194.x = fVar13 * local_138;
        local_190 = fVar24;
        local_18c = sinf(local_68);
        local_18c = local_18c * local_138;
        local_1a4.x = local_158 / local_198;
        local_1a0 = (float)local_178._0_4_;
        if (1.1920929e-07 <= (float)local_78._0_4_) {
          if ((float)local_178._0_4_ <= (float)local_f8._0_4_) {
            local_1a0 = local_98;
            if ((local_b8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) goto LAB_00211b69;
          }
          else {
            local_1a0 = (float)local_a8._0_4_;
            if (((uint)local_c8 & 1) == 0) {
LAB_00211b69:
              local_1a0 = (float)local_178._0_4_;
            }
          }
        }
        local_1a0 = 1.0 - local_1a0;
        Mesh::addTexCoord(__return_storage_ptr__,(vec2 *)&local_1a4);
        Mesh::addVertex(__return_storage_ptr__,(vec3 *)&local_194);
        Mesh::addNormal(__return_storage_ptr__,&local_188);
        local_158 = cosf((float)local_148._0_4_);
        fVar13 = sinf((float)local_148._0_4_);
        fVar22 = (1.0 - local_158) * 0.0;
        fVar14 = fVar22 * 0.0;
        fVar25 = fVar14 + local_158;
        fVar16 = fVar13 * 0.0 + fVar22;
        fVar22 = fVar13 * -0.0 + fVar22;
        fVar19 = (1.0 - local_158) + local_158;
        fVar28 = (fVar14 + fVar13) * 0.0;
        fVar27 = fVar25 * 0.0;
        fVar23 = (fVar14 - fVar13) * 0.0;
        fVar29 = fVar19 * 0.0;
        fVar20 = (fVar29 + fVar22 * 0.0 + fVar16) * local_188.field_1.y;
        fVar29 = local_188.field_1.y * (fVar16 * 0.0 + fVar22 + fVar29);
        fVar26 = (fVar16 * 0.0 + fVar27 + (fVar14 - fVar13)) * local_188.field_0.x;
        local_188.field_1.y =
             local_188.field_2.z * (fVar27 + fVar22 + fVar28) +
             local_188.field_0.x * (fVar23 + fVar16 + fVar27) +
             local_188.field_1.y * (fVar16 * 0.0 + fVar19 + fVar22 * 0.0);
        local_188.field_0.x =
             local_188.field_2.z * (fVar27 + fVar14 + fVar13 + fVar22 * 0.0) +
             local_188.field_0.x * (fVar23 + fVar25 + fVar16 * 0.0) + fVar29;
        local_188.field_2.z =
             fVar20 + fVar26 + (fVar22 * 0.0 + fVar28 + fVar25) * local_188.field_2.z;
        iVar7 = iVar7 + 1;
      } while (iVar4 != iVar7);
    }
    bVar11 = iVar6 != local_108._0_4_;
    iVar6 = iVar6 + 1;
  } while (bVar11);
  if (local_19c == TRIANGLES) {
    iVar6 = 0;
    do {
      if (0 < _radiusSegments) {
        uVar10 = iVar6 * iVar4 + iVar8;
        iVar7 = _radiusSegments;
        uVar5 = (iVar6 + 1) * iVar4 + iVar8;
        do {
          Mesh::addIndex(__return_storage_ptr__,uVar10);
          uVar10 = uVar10 + 1;
          Mesh::addIndex(__return_storage_ptr__,uVar10);
          Mesh::addIndex(__return_storage_ptr__,uVar5);
          Mesh::addIndex(__return_storage_ptr__,uVar10);
          Mesh::addIndex(__return_storage_ptr__,uVar5 + 1);
          Mesh::addIndex(__return_storage_ptr__,uVar5);
          iVar7 = iVar7 + -1;
          uVar5 = uVar5 + 1;
        } while (iVar7 != 0);
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 != local_108._0_4_);
  }
  else {
    iVar6 = 0;
    do {
      if (-1 < _radiusSegments) {
        uVar5 = iVar6 * iVar4 + iVar8;
        uVar10 = (iVar6 + 1) * iVar4 + iVar8;
        iVar7 = iVar4;
        do {
          Mesh::addIndex(__return_storage_ptr__,uVar5);
          Mesh::addIndex(__return_storage_ptr__,uVar10);
          uVar5 = uVar5 + 1;
          uVar10 = uVar10 + 1;
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 != local_108._0_4_);
  }
  if (bVar1 && _bCapped) {
    iVar6 = (int)((long)(__return_storage_ptr__->m_vertices).
                        super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(__return_storage_ptr__->m_vertices).
                        super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x55555555;
    local_188.field_0.x = 0.0;
    local_188.field_1.y = 1.0;
    local_188.field_2.z = 0.0;
    local_e8._0_4_ = (float)(int)local_160;
    local_148 = ZEXT416((uint)ABS(0.0 - (float)(int)local_160));
    local_108 = ZEXT416((uint)(0.0 - local_138));
    local_118 = ZEXT416((uint)(1.0 - fVar12));
    iVar8 = 0;
    do {
      if (-1 < _radiusSegments) {
        fVar24 = ((float)iVar8 / (float)local_e8._0_4_) * (float)local_108._0_4_ + local_138;
        fVar13 = ((float)iVar8 / (float)local_e8._0_4_) * (float)local_118._0_4_ +
                 (float)local_f8._0_4_;
        bVar1 = fVar24 < local_138;
        auVar17 = ZEXT812(0);
        if (fVar24 <= 0.0) {
          auVar17._4_8_ = 0;
          auVar17._0_4_ = fVar24;
        }
        local_78._12_4_ = 0;
        local_78._0_12_ = auVar17;
        auVar21 = ZEXT812(0);
        if (0.0 <= fVar24) {
          auVar21._4_8_ = 0;
          auVar21._0_4_ = fVar24;
        }
        local_88._12_4_ = 0;
        local_88._0_12_ = auVar21;
        local_98 = (float)-(uint)(fVar24 <= local_138 || fVar24 < 0.0);
        auVar18 = ZEXT812(0x3f800000);
        if (fVar13 <= 1.0) {
          auVar18._4_8_ = 0;
          auVar18._0_4_ = fVar13;
        }
        local_a8._12_4_ = 0;
        local_a8._0_12_ = auVar18;
        fVar22 = 1.0;
        if (1.0 <= fVar13) {
          fVar22 = fVar13;
        }
        local_b8 = ZEXT416((uint)fVar22);
        local_c8 = (float)-(uint)(1.0 < fVar13 || (float)local_f8._0_4_ <= fVar13);
        local_d8 = (float)-(uint)(fVar13 < 1.0 || fVar13 <= (float)local_f8._0_4_);
        iVar7 = 0;
        do {
          fVar13 = local_138;
          if (1.1920929e-07 <= (float)local_148._0_4_) {
            if (local_138 <= 0.0) {
              fVar13 = (float)local_78._0_4_;
              if (bVar1 && fVar24 <= 0.0) goto LAB_00211ff9;
            }
            else {
              fVar13 = (float)local_88._0_4_;
              if (((uint)local_98 & 1) == 0) {
LAB_00211ff9:
                fVar13 = local_138;
              }
            }
          }
          local_178._0_4_ = fVar13;
          local_158 = (float)iVar7;
          local_68 = (float)local_58._0_4_ * local_158;
          uStack_64 = local_58._4_4_;
          uStack_60 = local_58._8_4_;
          uStack_5c = local_58._12_4_;
          fVar13 = cosf(local_68);
          local_194.x = fVar13 * (float)local_178._0_4_;
          local_18c = sinf(local_68);
          local_18c = local_18c * (float)local_178._0_4_;
          local_190 = local_48;
          local_1a4.x = local_158 / local_198;
          local_1a0 = (float)local_f8._0_4_;
          if (1.1920929e-07 <= (float)local_148._0_4_) {
            if (fVar12 <= 1.0) {
              local_1a0 = (float)local_a8._0_4_;
              fVar13 = local_c8;
            }
            else {
              local_1a0 = (float)local_b8._0_4_;
              fVar13 = local_d8;
            }
            if (((uint)fVar13 & 1) == 0) {
              local_1a0 = (float)local_f8._0_4_;
            }
          }
          local_1a0 = 1.0 - local_1a0;
          Mesh::addTexCoord(__return_storage_ptr__,(vec2 *)&local_1a4);
          Mesh::addVertex(__return_storage_ptr__,(vec3 *)&local_194);
          Mesh::addNormal(__return_storage_ptr__,&local_188);
          iVar7 = iVar7 + 1;
        } while (iVar4 != iVar7);
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 != (int)local_128);
    iVar8 = (int)local_160;
    if (local_19c == TRIANGLES) {
      iVar7 = 1;
      if (1 < iVar8) {
        iVar7 = iVar8;
      }
      iVar8 = 0;
      do {
        if (0 < _radiusSegments) {
          uVar10 = (iVar8 + 1) * iVar4 + iVar6;
          uVar5 = iVar8 * iVar4 + iVar6;
          iVar9 = _radiusSegments;
          do {
            Mesh::addIndex(__return_storage_ptr__,uVar5);
            uVar5 = uVar5 + 1;
            Mesh::addIndex(__return_storage_ptr__,uVar5);
            Mesh::addIndex(__return_storage_ptr__,uVar10);
            if (2 < (int)local_128) {
              Mesh::addIndex(__return_storage_ptr__,uVar5);
              Mesh::addIndex(__return_storage_ptr__,uVar10 + 1);
              Mesh::addIndex(__return_storage_ptr__,uVar10);
            }
            uVar10 = uVar10 + 1;
            iVar9 = iVar9 + -1;
          } while (iVar9 != 0);
        }
        iVar8 = iVar8 + 1;
      } while (iVar8 != iVar7);
    }
    else {
      iVar7 = 1;
      if (1 < iVar8) {
        iVar7 = iVar8;
      }
      iVar8 = 0;
      do {
        if (-1 < _radiusSegments) {
          uVar5 = iVar8 * iVar4 + iVar6;
          uVar10 = (iVar8 + 1) * iVar4 + iVar6;
          iVar9 = iVar4;
          do {
            Mesh::addIndex(__return_storage_ptr__,uVar5);
            Mesh::addIndex(__return_storage_ptr__,uVar10);
            uVar5 = uVar5 + 1;
            uVar10 = uVar10 + 1;
            iVar9 = iVar9 + -1;
          } while (iVar9 != 0);
        }
        iVar8 = iVar8 + 1;
      } while (iVar8 != iVar7);
    }
  }
  Mesh::computeTangents(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Mesh cylinderMesh( float _radius, float _height, int _radiusSegments, int _heightSegments, int _numCapSegments, bool _bCapped, DrawMode _drawMode ) {
    Mesh mesh;

    if (_drawMode != TRIANGLE_STRIP && _drawMode != TRIANGLES)
        _drawMode = TRIANGLE_STRIP;
        
    mesh.setDrawMode(_drawMode);

    _radiusSegments = _radiusSegments+1;
    int capSegs = _numCapSegments;
    capSegs = capSegs+1;
    _heightSegments = _heightSegments+1;
    if (_heightSegments < 2) _heightSegments = 2;
    if ( capSegs < 2 ) _bCapped = false;
    if (!_bCapped) capSegs=1;

    float angleIncRadius = -1 * (TAU/((float)_radiusSegments-1.f));
    float heightInc = _height/((float)_heightSegments-1.f);
    float halfH = _height*.5f;

    float newRad;
    glm::vec3 vert;
    glm::vec2 tcoord;
    glm::vec3 normal;
    glm::vec3 up(0,1,0);

    std::size_t vertOffset = 0;

    float maxTexY   = _heightSegments-1.f;
    if (capSegs > 0)
        maxTexY += (capSegs*2)-2.f;
        
    float maxTexYNormalized = (capSegs-1.f) / maxTexY;

    // add the top cap //
    if (_bCapped && capSegs > 0) {
        normal = {0.f, -1.f, 0.f};
        for (int iy = 0; iy < capSegs; iy++) {
            for (int ix = 0; ix < _radiusSegments; ix++) {
                newRad = remap((float)iy, 0, capSegs-1, 0.0, _radius, true);
                vert.x = cos((float)ix*angleIncRadius) * newRad;
                vert.z = sin((float)ix*angleIncRadius) * newRad;
                vert.y = -halfH;

                tcoord.x = (float)ix/((float)_radiusSegments-1.f);
                tcoord.y = 1.f - remap(iy, 0, capSegs-1, 0, maxTexYNormalized, true);

                mesh.addTexCoord( tcoord );
                mesh.addVertex( vert );
                mesh.addNormal( normal );
            }
        }

        if (_drawMode == TRIANGLES) {
            for (int y = 0; y < capSegs-1; y++) {
                for (int x = 0; x < _radiusSegments-1; x++) {
                    if (y > 0) {
                        // first triangle //
                        mesh.addIndex( (y)*_radiusSegments + x + vertOffset );
                        mesh.addIndex( (y)*_radiusSegments + x+1 + vertOffset);
                        mesh.addIndex( (y+1)*_radiusSegments + x + vertOffset);
                    }

                    // second triangle //
                    mesh.addIndex( (y)*_radiusSegments + x+1 + vertOffset);
                    mesh.addIndex( (y+1)*_radiusSegments + x+1 + vertOffset);
                    mesh.addIndex( (y+1)*_radiusSegments + x + vertOffset);
                }
            }
        } else {
            for (int y = 0; y < capSegs-1; y++) {
                for (int x = 0; x < _radiusSegments; x++) {
                    mesh.addIndex( (y)*_radiusSegments + x + vertOffset );
                    mesh.addIndex( (y+1)*_radiusSegments + x + vertOffset);
                }
            }
        }

        vertOffset = mesh.getVerticesTotal();

    }

    //maxTexY            = _heightSegments-1.f + capSegs-1.f;
    float minTexYNormalized = 0;
    if (_bCapped) minTexYNormalized = maxTexYNormalized;
    maxTexYNormalized   = 1.f;
    if (_bCapped) maxTexYNormalized = (_heightSegments) / maxTexY;

    // cylinder vertices //
    for (int iy = 0; iy < _heightSegments; iy++) {
        normal = {1.f, 0.f, 0.f};
        for (int ix = 0; ix < _radiusSegments; ix++) {

            //newRad = remap((float)iy, 0, _heightSegments-1, 0.0, radius);
            vert.x = cos(ix*angleIncRadius) * _radius;
            vert.y = heightInc*float(iy) - halfH;
            vert.z = sin(ix*angleIncRadius) * _radius;

            tcoord.x = float(ix)/(float(_radiusSegments)-1.f);
            tcoord.y = 1.f - remap(iy, 0, _heightSegments-1, minTexYNormalized, maxTexYNormalized, true );

            mesh.addTexCoord( tcoord );
            mesh.addVertex( vert );
            mesh.addNormal( normal );

            normal = glm::rotate(normal, -angleIncRadius, up);

        }
    }

    if (_drawMode == TRIANGLES) {
        for (int y = 0; y < _heightSegments-1; y++) {
            for (int x = 0; x < _radiusSegments-1; x++) {
                // first triangle //
                mesh.addIndex( (y)*_radiusSegments + x + vertOffset);
                mesh.addIndex( (y)*_radiusSegments + x+1 + vertOffset );
                mesh.addIndex( (y+1)*_radiusSegments + x + vertOffset );

                // second triangle //
                mesh.addIndex( (y)*_radiusSegments + x+1 + vertOffset );
                mesh.addIndex( (y+1)*_radiusSegments + x+1 + vertOffset );
                mesh.addIndex( (y+1)*_radiusSegments + x + vertOffset );
            }
        }
    } else {
        for (int y = 0; y < _heightSegments-1; y++) {
            for (int x = 0; x < _radiusSegments; x++) {
                mesh.addIndex( (y)*_radiusSegments + x + vertOffset );
                mesh.addIndex( (y+1)*_radiusSegments + x + vertOffset );
            }
        }
    }

    vertOffset = mesh.getVerticesTotal();

    // add the bottom cap
    if (_bCapped && capSegs > 0) {
        minTexYNormalized = maxTexYNormalized;
        maxTexYNormalized   = 1.f;

        normal = {0.f, 1.f, 0.f};
        for (int iy = 0; iy < capSegs; iy++) {
            for (int ix = 0; ix < _radiusSegments; ix++) {
                newRad = remap((float)iy, 0, capSegs-1, _radius, 0.0, true);
                vert.x = cos((float)ix*angleIncRadius) * newRad;
                vert.z = sin((float)ix*angleIncRadius) * newRad;
                vert.y = halfH;

                tcoord.x = (float)ix/((float)_radiusSegments-1.f);
                tcoord.y = 1.f - remap(iy, 0, capSegs-1, minTexYNormalized, maxTexYNormalized, true);

                mesh.addTexCoord( tcoord );
                mesh.addVertex( vert );
                mesh.addNormal( normal );
            }
        }

        if (_drawMode == TRIANGLES) {
            for (int y = 0; y < capSegs-1; y++) {
                for (int x = 0; x < _radiusSegments-1; x++) {
                    // first triangle //
                    mesh.addIndex( (y)*_radiusSegments + x + vertOffset );
                    mesh.addIndex( (y)*_radiusSegments + x+1 + vertOffset);
                    mesh.addIndex( (y+1)*_radiusSegments + x + vertOffset);

                    if (y < capSegs -1 && capSegs > 2) {
                        // second triangle //
                        mesh.addIndex( (y)*_radiusSegments + x+1 + vertOffset);
                        mesh.addIndex( (y+1)*_radiusSegments + x+1 + vertOffset);
                        mesh.addIndex( (y+1)*_radiusSegments + x + vertOffset);
                    }
                }
            }
        } else {
            for (int y = 0; y < capSegs-1; y++) {
                for (int x = 0; x < _radiusSegments; x++) {
                    mesh.addIndex( (y)*_radiusSegments + x + vertOffset );
                    mesh.addIndex( (y+1)*_radiusSegments + x + vertOffset);
                }
            }
        }

        vertOffset = mesh.getVerticesTotal();
    }
    
    mesh.computeTangents();

    return mesh;
}